

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.h
# Opt level: O3

void __thiscall
arangodb::velocypack::Buffer<unsigned_char>::Buffer
          (Buffer<unsigned_char> *this,Buffer<unsigned_char> *that)

{
  ulong __size;
  ulong uVar1;
  uchar *__dest;
  undefined8 *puVar2;
  
  __dest = this->_local;
  this->_buffer = __dest;
  this->_capacity = 0xc0;
  this->_size = 0;
  this->_local[0] = '\0';
  __size = that->_size;
  if (__size != 0) {
    uVar1 = 0xc0;
    if (0xc0 < __size) {
      __dest = (uchar *)malloc(__size);
      this->_buffer = __dest;
      uVar1 = __size;
      if (__dest == (uchar *)0x0) {
        puVar2 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar2 = std::ios::widen;
        __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
    }
    this->_capacity = uVar1;
    memcpy(__dest,that->_buffer,__size);
    this->_size = that->_size;
  }
  return;
}

Assistant:

Buffer() noexcept : _buffer(_local), _capacity(sizeof(_local)), _size(0) {
    poison(_buffer, _capacity);
    initWithNone();
  }